

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotor.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsMotor::ArchiveOUT(ChShaftsMotor *this,ChArchiveOut *marchive)

{
  eCh_shaftsmotor_mode_mapper mmapper;
  ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> local_78;
  eCh_shaftsmotor_mode_mapper local_58;
  char *local_38;
  undefined1 *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChShaftsMotor>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChShaftsMotorBase>(marchive);
  ChArchiveOut::VersionWrite<chrono::ChShaftsCouple>(marchive);
  ChPhysicsItem::ArchiveOUT((ChPhysicsItem *)this,marchive);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::eCh_shaftsmotor_mode_mapper(&local_58);
  my_enum_mappers::eCh_shaftsmotor_mode_mapper::operator()(&local_78,&local_58,&this->motor_mode);
  local_38 = "motor_mode";
  local_28 = 0;
  local_30 = (undefined1 *)&local_78;
  (*(marchive->super_ChArchive)._vptr_ChArchive[0xb])(marchive);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b4b398
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_torque;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9963f2;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_set_rot;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9963ff;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_78.value_ptr = (eCh_shaftsmotor_mode *)&this->motor_set_rot_dt;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x99640d;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive);
  local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b4b398;
  if (local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChShaftsMotor::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChShaftsMotor>();

    // serialize parent class
    ChShaftsMotorBase::ArchiveOUT(marchive);

    // serialize all member data:
    my_enum_mappers::eCh_shaftsmotor_mode_mapper mmapper;
    marchive << CHNVP(mmapper(motor_mode), "motor_mode");
    marchive << CHNVP(motor_torque);
    marchive << CHNVP(motor_set_rot);
    marchive << CHNVP(motor_set_rot_dt);
}